

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O1

econf_err getFloatValueNum(econf_file key_file,size_t num,float *result)

{
  econf_err eVar1;
  int *piVar2;
  float fVar3;
  char *local_30;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  fVar3 = strtof(key_file.file_entry[num].value,&local_30);
  *result = fVar3;
  eVar1 = ECONF_VALUE_CONVERSION_ERROR;
  if (local_30 != key_file.file_entry[num].value) {
    eVar1 = ECONF_SUCCESS;
  }
  return eVar1;
}

Assistant:

econf_err getFloatValueNum(econf_file key_file, size_t num, float *result) {
  char *endptr;
  errno = 0;
  *result = strtof(key_file.file_entry[num].value, &endptr);
  if (endptr == key_file.file_entry[num].value) /* do not check errno because it is a false alarm in ppc and S390 */
    return ECONF_VALUE_CONVERSION_ERROR;
  return ECONF_SUCCESS;
}